

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O0

SyntaxTreeNode * __thiscall
RegexToDFAConverter::expression_eval(RegexToDFAConverter *this,string *expr,int *curr_pos)

{
  int iVar1;
  int iVar2;
  SyntaxTreeNode *this_00;
  char *pcVar3;
  size_type *psVar4;
  reference piVar5;
  bool bVar6;
  byte local_b9;
  int local_8c;
  _Node_iterator_base<int,_false> _Stack_88;
  int it_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range2_1;
  int local_5c;
  _Node_iterator_base<int,_false> _Stack_58;
  int it;
  iterator __end2;
  iterator __begin2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range2;
  SyntaxTreeNode *son;
  SyntaxTreeNode *local_28;
  SyntaxTreeNode *root;
  int *curr_pos_local;
  string *expr_local;
  RegexToDFAConverter *this_local;
  
  root = (SyntaxTreeNode *)curr_pos;
  curr_pos_local = (int *)expr;
  expr_local = (string *)this;
  this_00 = (SyntaxTreeNode *)operator_new(0x90);
  SyntaxTreeNode::SyntaxTreeNode(this_00);
  local_28 = this_00;
  __range2 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             term_eval(this,(string *)curr_pos_local,(int *)root);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
            (&local_28->first_pos,&((SyntaxTreeNode *)__range2)->first_pos);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::operator=
            (&local_28->last_pos,
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &__range2[1]._M_h._M_element_count);
  std::
  vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
  ::push_back(&local_28->sons,(value_type *)&__range2);
  local_28->nullable = (bool)(*(byte *)((long)&__range2[2]._M_h._M_element_count + 4) & 1);
  while( true ) {
    iVar1 = *(int *)&(root->sons).
                     super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = std::__cxx11::string::size();
    bVar6 = false;
    if (iVar1 < iVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)curr_pos_local);
      bVar6 = *pcVar3 == '|';
    }
    if (!bVar6) break;
    *(int *)&(root->sons).
             super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start =
         *(int *)&(root->sons).
                  super__Vector_base<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    __range2 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               term_eval(this,(string *)curr_pos_local,(int *)root);
    std::
    vector<RegexToDFAConverter::SyntaxTreeNode_*,_std::allocator<RegexToDFAConverter::SyntaxTreeNode_*>_>
    ::push_back(&local_28->sons,(value_type *)&__range2);
    local_b9 = 1;
    if ((local_28->nullable & 1U) == 0) {
      local_b9 = *(byte *)((long)&__range2[2]._M_h._M_element_count + 4);
    }
    local_28->nullable = (bool)(local_b9 & 1);
    psVar4 = &(__range2->_M_h)._M_element_count;
    __end2 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   psVar4);
    _Stack_58._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    psVar4);
    while (bVar6 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<int,_false>,&stack0xffffffffffffffa8
                             ), bVar6) {
      piVar5 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end2);
      local_5c = *piVar5;
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                (&local_28->first_pos,&local_5c);
      std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end2);
    }
    psVar4 = &__range2[1]._M_h._M_element_count;
    __end2_1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )psVar4);
    _Stack_88._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    psVar4);
    while (bVar6 = std::__detail::operator!=
                             (&__end2_1.super__Node_iterator_base<int,_false>,
                              &stack0xffffffffffffff78), bVar6) {
      piVar5 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end2_1);
      local_8c = *piVar5;
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                (&local_28->last_pos,&local_8c);
      std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end2_1);
    }
  }
  SyntaxTreeNode::wipe_sons(local_28);
  return local_28;
}

Assistant:

RegexToDFAConverter::SyntaxTreeNode* RegexToDFAConverter::expression_eval(
    const string &expr, int &curr_pos) {

  SyntaxTreeNode* root = new SyntaxTreeNode;
  auto son = term_eval(expr, curr_pos);
  root->first_pos = son->first_pos;
  root->last_pos = son->last_pos;
  root->sons.push_back(son);
  root->nullable = son->nullable;

  while (curr_pos < (int)expr.size() && expr[curr_pos] == '|') {
    son = term_eval(expr, ++curr_pos);
    root->sons.push_back(son);
    root->nullable = (root->nullable || son->nullable);
    for (int it : son->first_pos)
      root->first_pos.insert(it);
    for (int it : son->last_pos)
      root->last_pos.insert(it);
  }

  root->wipe_sons();
  return root;
}